

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O2

void __thiscall QtMWidgets::Switch::paintEvent(Switch *this,QPaintEvent *param_1)

{
  State SVar1;
  int iVar2;
  SwitchPrivate *pSVar3;
  QColor *pQVar4;
  double xRadius;
  QColor QVar5;
  QPainter p;
  undefined1 local_f8 [12];
  int iStack_ec;
  QPainterPath glow;
  QColor lightColor;
  QPainterPath rect;
  QColor borderColor;
  QColor lightAlphaColor;
  QStyleOption opt;
  uint local_40;
  int local_38;
  QPalette local_28 [24];
  
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  pQVar4 = QPalette::color(local_28,Shadow);
  borderColor._0_8_ = *(undefined8 *)pQVar4;
  borderColor._8_8_ = *(undefined8 *)((long)&pQVar4->ct + 4);
  pQVar4 = QPalette::color(local_28,Base);
  lightColor._0_8_ = *(undefined8 *)pQVar4;
  lightColor._8_8_ = *(undefined8 *)((long)&pQVar4->ct + 4);
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  QPainter::translate(&p,1.0,1.0);
  QPainter::setRenderHint((RenderHint)&p,true);
  pSVar3 = (this->d).d;
  SVar1 = pSVar3->state;
  if (SVar1 < NotAcceptedCheck) {
    local_f8._0_8_ = 0.0;
    stack0xffffffffffffff10 = 0.0;
    _rect = 0.0;
    QLinearGradient::QLinearGradient
              ((QLinearGradient *)&lightAlphaColor,(QPointF *)local_f8,(QPointF *)&rect);
    QGradient::setCoordinateMode((CoordinateMode)&lightAlphaColor);
    QVar5 = darkerColor(&lightColor,0x4b);
    local_f8._0_8_ = QVar5._0_8_;
    stack0xffffffffffffff10 = QVar5.ct._4_6_;
    QGradient::setColorAt(0.0,&lightAlphaColor);
    QVar5 = darkerColor(&lightColor,0x19);
    local_f8._0_8_ = QVar5._0_8_;
    stack0xffffffffffffff10 = QVar5.ct._4_6_;
    QGradient::setColorAt(0.1,&lightAlphaColor);
    QVar5 = darkerColor(&lightColor,10);
    local_f8._0_8_ = QVar5._0_8_;
    stack0xffffffffffffff10 = QVar5.ct._4_6_;
    QGradient::setColorAt(1.0,&lightAlphaColor);
    QBrush::QBrush((QBrush *)local_f8,(QGradient *)&lightAlphaColor);
    QPainter::setBrush((QBrush *)&p);
    QBrush::~QBrush((QBrush *)local_f8);
    QLinearGradient::~QLinearGradient((QLinearGradient *)&lightAlphaColor);
  }
  else {
    if (SVar1 == NotAcceptedCheck) {
      QVar5 = darkerColor(&pSVar3->onColor,0x32);
      lightAlphaColor._0_8_ = QVar5._0_8_;
      lightAlphaColor.ct._4_6_ = QVar5.ct._4_6_;
      QBrush::QBrush((QBrush *)local_f8,&lightAlphaColor,SolidPattern);
      QPainter::setBrush((QBrush *)&p);
      pQVar4 = (QColor *)local_f8;
    }
    else {
      if (SVar1 != AcceptedCheck) goto LAB_0018a4f5;
      QBrush::QBrush((QBrush *)&lightAlphaColor,&pSVar3->onColor,SolidPattern);
      QPainter::setBrush((QBrush *)&p);
      pQVar4 = &lightAlphaColor;
    }
    QBrush::~QBrush((QBrush *)pQVar4);
  }
LAB_0018a4f5:
  QPainter::setPen((QColor *)&p);
  QPainterPath::QPainterPath(&rect);
  iVar2 = ((this->d).d)->radius;
  xRadius = (double)iVar2;
  QPainterPath::addRoundedRect
            (&rect,0.0,0.0,(double)(int)(~local_40 + local_38),(double)(iVar2 * 2),xRadius,xRadius,
             AbsoluteSize);
  QPainter::drawPath((QPainterPath *)&p);
  SwitchPrivate::drawText((this->d).d,&p,&opt,&lightColor,&borderColor);
  lightAlphaColor._0_8_ = lightColor._0_8_;
  lightAlphaColor._8_8_ = lightColor._8_8_;
  QColor::setAlpha((int)&lightAlphaColor);
  QPainter::setPen((PenStyle)&p);
  QBrush::QBrush((QBrush *)local_f8,&lightAlphaColor,SolidPattern);
  QPainter::setBrush((QBrush *)&p);
  QBrush::~QBrush((QBrush *)local_f8);
  QPainterPath::QPainterPath(&glow);
  iVar2 = ((this->d).d)->radius;
  QPainterPath::addRoundedRect
            (&glow,(double)(iVar2 / 4),(double)iVar2,
             (double)(int)(((iVar2 / -2 + local_38) - local_40) + 1),(double)(iVar2 * 2),
             (double)(iVar2 / 2),(double)(iVar2 / 2),AbsoluteSize);
  QPainterPath::intersected((QPainterPath *)local_f8);
  QPainter::drawPath((QPainterPath *)&p);
  QPainterPath::~QPainterPath((QPainterPath *)local_f8);
  pSVar3 = (this->d).d;
  iVar2 = pSVar3->radius;
  local_f8._0_4_ = pSVar3->offset;
  local_f8._4_4_ = 0;
  stack0xffffffffffffff10 = (qreal)CONCAT44(iVar2 * 2 + -1,local_f8._0_4_ + iVar2 * 2 + -1);
  drawSliderHandle(&p,(QRect *)local_f8,iVar2,iVar2,&borderColor,&lightColor);
  QPainterPath::~QPainterPath(&glow);
  QPainterPath::~QPainterPath(&rect);
  QPainter::~QPainter(&p);
  QStyleOption::~QStyleOption(&opt);
  return;
}

Assistant:

void
Switch::paintEvent( QPaintEvent * )
{
	QStyleOption opt;
	opt.initFrom( this );

	QColor borderColor = opt.palette.color( QPalette::Shadow );
	QColor lightColor = opt.palette.color( QPalette::Base );

	QPainter p( this );
	p.translate( 1.0, 1.0 );
	p.setRenderHint( QPainter::Antialiasing );

	switch( d->state )
	{
		case NotAcceptedUncheck :
		case AcceptedUncheck :
		{
			QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
			g.setCoordinateMode( QGradient::ObjectBoundingMode );
			g.setColorAt( 0.0, darkerColor( lightColor, 75 ) );
			g.setColorAt( 0.1, darkerColor( lightColor, 25 ) );
			g.setColorAt( 1.0, darkerColor( lightColor, 10 ) );

			p.setBrush( g );
		}
		break;

		case NotAcceptedCheck :
			p.setBrush( darkerColor( d->onColor, 50 ) );
		break;

		case AcceptedCheck :
			p.setBrush( d->onColor );
		break;
	}

	p.setPen( borderColor );

	QPainterPath rect;
	rect.addRoundedRect( 0, 0, opt.rect.width() - 2, d->radius * 2,
		d->radius, d->radius );

	p.drawPath( rect );

	d->drawText( &p, opt, lightColor, borderColor );

	QColor lightAlphaColor = lightColor;
	lightAlphaColor.setAlpha( 50 );

	p.setPen( Qt::NoPen );
	p.setBrush( lightAlphaColor );

	QPainterPath glow;
	glow.addRoundedRect( d->radius / 4, d->radius,
		opt.rect.width() - d->radius / 2, d->radius * 2,
		d->radius / 2, d->radius / 2 );

	p.drawPath( rect.intersected( glow ) );

	drawSliderHandle( &p, QRect( d->offset, 0,
		d->radius * 2, d->radius * 2 ),
			d->radius, d->radius, borderColor, lightColor );
}